

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::anon_unknown_1::BuiltinVariableShader::getTestAttributeName
                 (VariableTest test)

{
  char *pcStack_10;
  VariableTest test_local;
  
  if (test == TEST_POINT_SIZE) {
    pcStack_10 = "a_pointSize";
  }
  else if (test == TEST_PRIMITIVE_ID_IN) {
    pcStack_10 = "";
  }
  else if (test == TEST_PRIMITIVE_ID) {
    pcStack_10 = "a_primitiveID";
  }
  else {
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* BuiltinVariableShader::getTestAttributeName (VariableTest test)
{
	switch (test)
	{
		case TEST_POINT_SIZE:			return "a_pointSize";
		case TEST_PRIMITIVE_ID_IN:		return "";
		case TEST_PRIMITIVE_ID:			return "a_primitiveID";
		default:
			DE_ASSERT(DE_FALSE);
			return "";
	}
}